

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_zipx_xz(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long request;
  uint uVar2;
  wchar_t wVar3;
  void *pvVar4;
  ulong uVar5;
  char *pcVar6;
  int error_number;
  ssize_t bytes_avail;
  long local_30;
  
  pvVar1 = a->format->data;
  if (*(char *)((long)pvVar1 + 0xa1) == '\0') {
    if (*(char *)((long)pvVar1 + 0x1b8) != '\0') {
      lzma_end((long)pvVar1 + 0x130);
      *(undefined1 *)((long)pvVar1 + 0x1b8) = 0;
    }
    memset((void *)((long)pvVar1 + 0x130),0,0x88);
    uVar2 = lzma_stream_decoder((void *)((long)pvVar1 + 0x130),0xffffffffffffffff,0);
    if (uVar2 != 0) {
      archive_set_error(&a->archive,-1,"xz initialization failed(%d)",(ulong)uVar2);
      return L'\xffffffe7';
    }
    *(undefined1 *)((long)pvVar1 + 0x1b8) = 1;
    free(*(void **)((long)pvVar1 + 0xa8));
    *(undefined8 *)((long)pvVar1 + 0xb0) = 0x40000;
    pvVar4 = malloc(0x40000);
    *(void **)((long)pvVar1 + 0xa8) = pvVar4;
    if (pvVar4 != (void *)0x0) {
      *(undefined1 *)((long)pvVar1 + 0xa1) = 1;
      goto LAB_00141eec;
    }
    pcVar6 = "No memory for xz decompression";
    error_number = 0xc;
LAB_00142055:
    archive_set_error(&a->archive,error_number,pcVar6);
    goto LAB_001420ce;
  }
LAB_00141eec:
  pvVar4 = __archive_read_ahead(a,1,&local_30);
  if (local_30 < 0) {
    pcVar6 = "Truncated xz file body";
    error_number = 0x54;
    goto LAB_00142055;
  }
  if (*(long *)((long)pvVar1 + 0x78) < local_30) {
    local_30 = *(long *)((long)pvVar1 + 0x78);
  }
  *(void **)((long)pvVar1 + 0x130) = pvVar4;
  *(long *)((long)pvVar1 + 0x138) = local_30;
  *(undefined8 *)((long)pvVar1 + 0x140) = 0;
  *(undefined4 *)((long)pvVar1 + 0x148) = *(undefined4 *)((long)pvVar1 + 0xa8);
  *(undefined4 *)((long)pvVar1 + 0x14c) = *(undefined4 *)((long)pvVar1 + 0xac);
  *(undefined4 *)((long)pvVar1 + 0x150) = *(undefined4 *)((long)pvVar1 + 0xb0);
  *(undefined4 *)((long)pvVar1 + 0x154) = *(undefined4 *)((long)pvVar1 + 0xb4);
  *(undefined8 *)((long)pvVar1 + 0x158) = 0;
  uVar2 = lzma_code((long)pvVar1 + 0x130,0);
  switch(uVar2) {
  case 1:
    lzma_end((long)pvVar1 + 0x130);
    *(undefined1 *)((long)pvVar1 + 0x1b8) = 0;
    if (*(long *)((long)pvVar1 + 0x140) != *(long *)((long)pvVar1 + 0x78)) {
      pcVar6 = "xz premature end of stream";
      error_number = -1;
      goto LAB_00142055;
    }
    *(undefined1 *)((long)pvVar1 + 0xa2) = 1;
  case 0:
  case 2:
    request = *(long *)((long)pvVar1 + 0x140);
    __archive_read_consume(a,request);
    *(long *)((long)pvVar1 + 0x78) = *(long *)((long)pvVar1 + 0x78) - request;
    *(long *)((long)pvVar1 + 0x80) = *(long *)((long)pvVar1 + 0x80) + request;
    *(long *)((long)pvVar1 + 0x88) =
         *(long *)((long)pvVar1 + 0x88) + *(size_t *)((long)pvVar1 + 0x158);
    *size = *(size_t *)((long)pvVar1 + 0x158);
    *buff = *(void **)((long)pvVar1 + 0xa8);
    wVar3 = L'\0';
    break;
  default:
    pcVar6 = "xz unknown error %d";
    uVar5 = (ulong)uVar2;
    goto LAB_001420c7;
  case 9:
    pcVar6 = "xz data error (error %d)";
    uVar5 = 9;
LAB_001420c7:
    archive_set_error(&a->archive,-1,pcVar6,uVar5);
LAB_001420ce:
    wVar3 = L'\xffffffe2';
  }
  return wVar3;
}

Assistant:

static int
zip_read_data_zipx_xz(struct archive_read *a, const void **buff,
	size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume = 0;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_xz_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated xz file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = (ssize_t)zipmin(zip->entry_bytes_remaining, bytes_avail);
	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out = zip->uncompressed_buffer_size;
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_NO_CHECK:
		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;

			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xz premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;
	}

	to_consume = (ssize_t)zip->zipx_lzma_stream.total_in;

	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	*size = (size_t)zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	return (ARCHIVE_OK);
}